

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int32_t counts_index_for(hdr_histogram *h,int64_t value)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = h->sub_bucket_mask | value;
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar3 = ((uint)lVar1 ^ 0x3f) + h->sub_bucket_half_count_magnitude + h->unit_magnitude;
  return ((0x40 - iVar3 << ((byte)h->sub_bucket_half_count_magnitude & 0x1f)) -
         h->sub_bucket_half_count) +
         (int)(value >> (((char)h->unit_magnitude - (char)iVar3) + 0x3fU & 0x3f));
}

Assistant:

int32_t counts_index_for(const struct hdr_histogram* h, int64_t value)
{
    int32_t bucket_index     = get_bucket_index(h, value);
    int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, h->unit_magnitude);

    return counts_index(h, bucket_index, sub_bucket_index);
}